

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

void __thiscall mat_lib::vector<double>::vector(vector<double> *this,string *file_name)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  logic_error *plVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  numbers;
  string_type local_430;
  regex rx;
  is_any_ofF<char> local_3f0;
  cmatch results;
  string str;
  ifstream ifs;
  byte abStack_218 [200];
  undefined8 auStack_150 [36];
  
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->format__ = fixed;
  this->fractional_digits__ = 6;
  std::ifstream::ifstream(&ifs,(string *)file_name,_S_in);
  if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
    poVar4 = std::operator<<((ostream *)&str,"cannot open file \"");
    poVar4 = std::operator<<(poVar4,(string *)file_name);
    poVar4 = std::operator<<(poVar4,"\"! (");
    poVar4 = std::operator<<(poVar4,"vector");
    poVar4 = std::operator<<(poVar4,"() in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x3a6);
    std::operator<<(poVar4,")");
    plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::logic_error::logic_error(plVar5,(string *)&rx);
    __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  str._M_dataplus._M_p = (pointer)&str.field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&str,*(undefined8 *)((long)auStack_150 + *(long *)(_ifs + -0x18)),
             0xffffffffffffffff,0,0xffffffff);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&rx,
             "mat_lib::vector\\[(\\d)\\]\\{(([-+]?\\d*\\.?\\d+([eE][-+]?\\d+)?(,\\s|\\n\\s*)?)+)+\\}"
             ,0x10);
  results.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results._M_begin = (char *)0x0;
  results.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  results.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = std::
          regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
                    (str._M_dataplus._M_p,&results,&rx,0);
  if (bVar1) {
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::str
              (&local_430,&results,1);
    iVar2 = std::__cxx11::stoi(&local_430,(size_t *)0x0,10);
    this->max_size__ = (long)iVar2;
    std::__cxx11::string::~string((string *)&local_430);
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::str
              (&local_430,&results,2);
    boost::algorithm::is_any_of<char[6]>(&local_3f0,(char (*) [6])"(,|\n)");
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
              (&numbers,&local_430,&local_3f0,token_compress_off);
    boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_3f0);
    std::__cxx11::string::~string((string *)&local_430);
    uVar3 = (long)numbers.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)numbers.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar3 == this->max_size__) {
      lVar6 = 0;
      for (uVar7 = 0; uVar7 < uVar3; uVar7 = uVar7 + 1) {
        local_430._M_dataplus._M_p =
             (pointer)std::__cxx11::stod((string *)
                                         ((long)&((numbers.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar6),(size_t *)0x0);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (&this->container__,(double *)&local_430);
        uVar3 = this->max_size__;
        lVar6 = lVar6 + 0x20;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&numbers);
      std::
      _Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       *)&results);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&rx);
      std::__cxx11::string::~string((string *)&str);
      std::ifstream::~ifstream(&ifs);
      return;
    }
    plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar5,"the file are incorrect: bad declaration of matrix");
    __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar5,"the file are incorrect: bad expresion");
  __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

vector<T>::vector(const string &file_name) {
        ifstream ifs(file_name);
        if(!ifs)
        {
            ostringstream str_stream;
            str_stream<<"cannot open file \""<<file_name<<"\"! ("
                      <<__func__<<"() in "<<__FILE__<<":"<<__LINE__<<")";
            throw logic_error(str_stream.str());
        }

        string str((istreambuf_iterator<char>(ifs)),
                   istreambuf_iterator<char>());

        regex rx(R"(mat_lib::vector\[(\d)\]\{(([-+]?\d*\.?\d+([eE][-+]?\d+)?(,\s|\n\s*)?)+)+\})");
        cmatch results;
        if (not regex_match(str.c_str(),results,rx)) {
            throw logic_error("the file are incorrect: bad expresion");
        }

        max_size__ = stoi(results.str(1));
        std::vector<string> numbers;
        boost::split(numbers, results.str(2), boost::is_any_of("(,|\n)"));


        if (numbers.size() != max_size__) {
            throw logic_error("the file are incorrect: bad declaration of matrix");
        }

        for(size_t i=0; i<max_size__; i++) {
            container__.push_back(stod(numbers[i]));
        }

    }